

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::focusOutEvent(QWidget *this,QFocusEvent *param_1)

{
  bool bVar1;
  
  if (((this->data->field_0x10 & 0xf0) != 0) ||
     (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
    update(this);
  }
  bVar1 = QApplication::autoSipEnabled(QCoreApplication::self);
  if ((bVar1) && ((this->data->widget_attributes & 0x4000) != 0)) {
    QGuiApplication::inputMethod();
    QInputMethod::hide();
    return;
  }
  return;
}

Assistant:

void QWidget::focusOutEvent(QFocusEvent *)
{
    if (focusPolicy() != Qt::NoFocus || !isWindow())
        update();

#if !defined(QT_PLATFORM_UIKIT)
    // FIXME: revisit autoSIP logic, QTBUG-42906
    if (qApp->autoSipEnabled() && testAttribute(Qt::WA_InputMethodEnabled))
        QGuiApplication::inputMethod()->hide();
#endif
}